

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O0

void __thiscall
r_exec::CSTController::inject_goal
          (CSTController *this,HLPBindingMap *bm,Fact *super_goal,_Fact *sub_goal_target,Sim *sim,
          uint64_t now,double confidence,Code *group)

{
  uint16_t uVar1;
  Goal *this_00;
  Goal *pGVar2;
  Code *pCVar3;
  Code *object;
  View *pVVar4;
  _Mem *p_Var5;
  MkRdx *this_01;
  Sim *s;
  View *view_1;
  Group *out_group;
  uint16_t i;
  uint16_t out_group_count;
  MkRdx *mk_rdx;
  View *view;
  _Fact *sub_goal_f;
  _Fact *f_icst;
  Goal *sub_goal;
  double confidence_local;
  uint64_t now_local;
  Sim *sim_local;
  _Fact *sub_goal_target_local;
  Fact *super_goal_local;
  HLPBindingMap *bm_local;
  CSTController *this_local;
  
  _Fact::set_cfd(sub_goal_target,confidence);
  this_00 = (Goal *)operator_new(0x160);
  pGVar2 = _Fact::get_goal(&super_goal->super__Fact);
  pCVar3 = Goal::get_actor(pGVar2);
  Goal::Goal(this_00,sub_goal_target,pCVar3,1.0);
  s = sim;
  core::P<r_exec::Sim>::operator=(&this_00->sim,sim);
  pGVar2 = _Fact::get_goal(&super_goal->super__Fact);
  pCVar3 = (Code *)Goal::get_target(pGVar2);
  object = (Code *)Fact::operator_new((Fact *)0x150,(size_t)s);
  Fact::Fact((Fact *)object,(Code *)this_00,now,now,1.0,1.0);
  pVVar4 = (View *)operator_new(0x100);
  View::View(pVVar4,SYNC_ONCE,now,confidence,1,group,group,object);
  p_Var5 = _Mem::Get();
  _Mem::inject(p_Var5,pVVar4);
  if (sim->mode == SIM_ROOT) {
    this_01 = (MkRdx *)operator_new(0x158);
    MkRdx::MkRdx(this_01,pCVar3,(Code *)super_goal,(Code *)this_00,1.0,&bm->super_BindingMap);
    uVar1 = HLPController::get_out_group_count(&this->super_HLPController);
    for (out_group._4_2_ = 0; out_group._4_2_ < uVar1; out_group._4_2_ = out_group._4_2_ + 1) {
      pCVar3 = HLPController::get_out_group(&this->super_HLPController,out_group._4_2_);
      pVVar4 = (View *)operator_new(0x100);
      NotificationView::NotificationView((NotificationView *)pVVar4,group,pCVar3,(Code *)this_01);
      p_Var5 = _Mem::Get();
      _Mem::inject_notification(p_Var5,pVVar4,true);
    }
  }
  return;
}

Assistant:

void CSTController::inject_goal(HLPBindingMap *bm,
                                Fact *super_goal, // f0->g->f1->icst or f0->g->|f1->icst.
                                _Fact *sub_goal_target, // f1.
                                Sim *sim,
                                uint64_t now,
                                double confidence,
                                Code *group) const
{
    sub_goal_target->set_cfd(confidence);
    Goal *sub_goal = new Goal(sub_goal_target, super_goal->get_goal()->get_actor(), 1);
    sub_goal->sim = sim;
    _Fact *f_icst = super_goal->get_goal()->get_target();
    _Fact *sub_goal_f = new Fact(sub_goal, now, now, 1, 1);
    View *view = new View(View::SYNC_ONCE, now, confidence, 1, group, group, sub_goal_f); // SYNC_ONCE,res=1.
    _Mem::Get()->inject(view);

    if (sim->mode == SIM_ROOT) { // no rdx for SIM_OPTIONAL or SIM_MANDATORY.
        MkRdx *mk_rdx = new MkRdx(f_icst, super_goal, sub_goal, 1, bm);
        uint16_t out_group_count = get_out_group_count();

        for (uint16_t i = 0; i < out_group_count; ++i) {
            Group *out_group = (Group *)get_out_group(i);
            View *view = new NotificationView(group, out_group, mk_rdx);
            _Mem::Get()->inject_notification(view, true);
        }
    }
}